

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall xe::TcpIpLink::closeConnection(TcpIpLink *this)

{
  bool bVar1;
  deSocketState dVar2;
  deBool dVar3;
  int __how;
  int in_ESI;
  deSocketState state;
  TcpIpLink *this_local;
  
  dVar2 = de::Socket::getState(&this->m_socket);
  if ((dVar2 != DE_SOCKETSTATE_DISCONNECTED) && (dVar2 != DE_SOCKETSTATE_CLOSED)) {
    de::Socket::shutdown(&this->m_socket,in_ESI,__how);
  }
  dVar3 = deTimer_isActive(this->m_keepaliveTimer);
  if (dVar3 != 0) {
    deTimer_disable(this->m_keepaliveTimer);
  }
  bVar1 = TcpIpSendThread::isRunning(&this->m_sendThread);
  if (bVar1) {
    TcpIpSendThread::stop(&this->m_sendThread);
  }
  bVar1 = TcpIpRecvThread::isRunning(&this->m_recvThread);
  if (bVar1) {
    TcpIpRecvThread::stop(&this->m_recvThread);
  }
  dVar2 = de::Socket::getState(&this->m_socket);
  if (dVar2 != DE_SOCKETSTATE_CLOSED) {
    de::Socket::close(&this->m_socket,in_ESI);
  }
  return;
}

Assistant:

void TcpIpLink::closeConnection (void)
{
	{
		deSocketState state = m_socket.getState();
		if (state != DE_SOCKETSTATE_DISCONNECTED && state != DE_SOCKETSTATE_CLOSED)
			m_socket.shutdown();
	}

	if (deTimer_isActive(m_keepaliveTimer))
		deTimer_disable(m_keepaliveTimer);

	if (m_sendThread.isRunning())
		m_sendThread.stop();

	if (m_recvThread.isRunning())
		m_recvThread.stop();

	if (m_socket.getState() != DE_SOCKETSTATE_CLOSED)
		m_socket.close();
}